

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

int __thiscall Qclass::rewardfunc(Qclass *this,int lastAction,int x,int y)

{
  int in_EAX;
  int iVar1;
  uint uVar2;
  
  if ((lastAction == 0) &&
     ((iVar1 = x + 1, iVar1 != this->goal_x || (in_EAX = 1000, this->goal_y != y)))) {
    if (x < 0x31) {
      in_EAX = this->grid[iVar1][y] * -10000 + -0x32;
    }
    else {
      this->restart = true;
      in_EAX = -10000;
    }
    if (this->grid[iVar1][y] == 1) {
      this->restart = true;
    }
  }
  if ((lastAction == 1) &&
     ((uVar2 = x - 1, uVar2 != this->goal_x || (in_EAX = 1000, this->goal_y != y)))) {
    if (x < 1) {
      this->restart = true;
      in_EAX = -10000;
    }
    else {
      in_EAX = this->grid[uVar2][y] * -10000 + -0x32;
    }
    if (this->grid[(int)uVar2][y] == 1) {
      this->restart = true;
    }
  }
  if ((lastAction == 2) && ((this->goal_x != x || (in_EAX = 1000, y + 1 != this->goal_y)))) {
    if (y < 0x31) {
      in_EAX = this->grid[x][y + 1] * -10000 + -0x32;
    }
    else {
      this->restart = true;
      in_EAX = -10000;
    }
    if (this->grid[x][y + 1] == 1) {
      this->restart = true;
    }
  }
  if ((lastAction == 3) && ((this->goal_x != x || (in_EAX = 1000, y + -1 != this->goal_y)))) {
    if (y < 1) {
      this->restart = true;
      in_EAX = -10000;
    }
    else {
      in_EAX = this->grid[x][y - 1U] * -10000 + -0x32;
    }
    if (this->grid[x][(int)(y - 1U)] == 1) {
      this->restart = true;
    }
  }
  return in_EAX;
}

Assistant:

int Qclass::rewardfunc(int lastAction, int x, int y) {
  int reward;
  if (lastAction == 0) {
    // High positive reward for reaching the goal state
    if (x + 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      // High negative reward for exceeding map boundaries
      // High negative reward when obstacle is present
      if (x + 1 <= 49) {
        reward = grid[x + 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x + 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 1) {
    if (x - 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      if (x - 1 >= 0) {
        reward = grid[x - 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x - 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 2) {
    if (x == goal_x && y + 1 == goal_y) {
      reward = 1000;
    } else {
      if (y + 1 <= 49) {
        reward = grid[x][y + 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y + 1] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 3) {
    if (x == goal_x && y - 1 == goal_y) {
      reward = 1000;
    } else {
      if (y - 1 >= 0) {
        reward = grid[x][y - 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y - 1] == 1) {
        restart = true;
      }
    }
  }
  return reward;
}